

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O1

void Gia_Sim2ProcessRefined(Gia_Sim2_t *p,Vec_Int_t *vRefined)

{
  Gia_Rpr_t GVar1;
  Gia_Man_t *pGVar2;
  Gia_Rpr_t *pGVar3;
  uint uVar4;
  int iVar5;
  void *__ptr;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint nTableSize;
  long lVar9;
  
  if (vRefined->nSize != 0) {
    uVar8 = vRefined->nSize / 3 + 999;
    while( true ) {
      do {
        nTableSize = uVar8 + 1;
        uVar4 = uVar8 & 1;
        uVar8 = nTableSize;
      } while (uVar4 != 0);
      if (nTableSize < 9) break;
      iVar6 = 5;
      while (nTableSize % (iVar6 - 2U) != 0) {
        uVar4 = iVar6 * iVar6;
        iVar6 = iVar6 + 2;
        if (nTableSize < uVar4) goto LAB_007195c4;
      }
    }
LAB_007195c4:
    __ptr = calloc((long)(int)nTableSize,4);
    if (0 < vRefined->nSize) {
      lVar9 = 0;
      do {
        iVar6 = vRefined->pArray[lVar9];
        iVar5 = Gia_Sim2HashKey(p->pDataSim + p->nWords * iVar6,p->nWords,nTableSize);
        uVar8 = *(uint *)((long)__ptr + (long)iVar5 * 4);
        lVar7 = (long)(int)uVar8;
        pGVar2 = p->pAig;
        if (lVar7 == 0) {
          GVar1 = pGVar2->pReprs[iVar6];
          if (((uint)GVar1 & 0xfffffff) != 0) {
            __assert_fail("Gia_ObjRepr(p->pAig, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                          ,0x1e2,"void Gia_Sim2ProcessRefined(Gia_Sim2_t *, Vec_Int_t *)");
          }
          if (pGVar2->pNexts[iVar6] != 0) {
            __assert_fail("Gia_ObjNext(p->pAig, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                          ,0x1e3,"void Gia_Sim2ProcessRefined(Gia_Sim2_t *, Vec_Int_t *)");
          }
          pGVar2->pReprs[iVar6] = (Gia_Rpr_t)((uint)GVar1 | 0xfffffff);
        }
        else {
          pGVar2->pNexts[lVar7] = iVar6;
          pGVar3 = pGVar2->pReprs;
          uVar4 = (uint)pGVar3[lVar7] & 0xfffffff;
          if ((uVar4 != 0xfffffff) && (iVar6 <= (int)uVar4)) {
LAB_0071971d:
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x38c,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          pGVar3[iVar6] = (Gia_Rpr_t)((uint)pGVar3[iVar6] & 0xf0000000 | uVar4);
          pGVar3 = p->pAig->pReprs;
          GVar1 = pGVar3[iVar6];
          if ((~(uint)GVar1 & 0xfffffff) == 0) {
            if ((uVar8 != 0xfffffff) && (iVar6 <= (int)uVar8)) goto LAB_0071971d;
            pGVar3[iVar6] = (Gia_Rpr_t)((uint)GVar1 & 0xf0000000 | uVar8 & 0xfffffff);
          }
          if (((uint)p->pAig->pReprs[iVar6] & 0xfffffff) == 0) {
            __assert_fail("Gia_ObjRepr(p->pAig, i) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                          ,0x1ec,"void Gia_Sim2ProcessRefined(Gia_Sim2_t *, Vec_Int_t *)");
          }
        }
        *(int *)((long)__ptr + (long)iVar5 * 4) = iVar6;
        lVar9 = lVar9 + 1;
      } while (lVar9 < vRefined->nSize);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void Gia_Sim2ProcessRefined( Gia_Sim2_t * p, Vec_Int_t * vRefined )
{
    unsigned * pSim;
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 1000 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        pSim = Gia_Sim2Data( p, i );
        Key = Gia_Sim2HashKey( pSim, p->nWords, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p->pAig, i) == 0 );
            assert( Gia_ObjNext(p->pAig, i) == 0 );
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p->pAig, pTable[Key], i );
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjRepr(p->pAig, pTable[Key]) );
            if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID )
                Gia_ObjSetRepr( p->pAig, i, pTable[Key] );
            assert( Gia_ObjRepr(p->pAig, i) > 0 );
        }
        pTable[Key] = i;
    }
/*
    Vec_IntForEachEntry( vRefined, i, k )
    {
        if ( Gia_ObjIsHead( p->pAig, i ) )
            Gia_Sim2ClassRefineOne( p, i );
    }
*/
    ABC_FREE( pTable );
}